

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int StringReplaceWalker(jx9_value *pKey,jx9_value *pData,void *pUserData)

{
  int iVar1;
  sxu32 local_54;
  sxi32 rc;
  sxu32 nOfft;
  int nLen;
  int tLen;
  SyBlob *pWorker;
  char *zReplace;
  char *zTarget;
  str_replace_data *pRepData;
  void *pUserData_local;
  jx9_value *pData_local;
  jx9_value *pKey_local;
  
  _nLen = *pUserData;
  zTarget = (char *)pUserData;
  pRepData = (str_replace_data *)pUserData;
  pUserData_local = pData;
  pData_local = pKey;
  iVar1 = jx9_value_is_string(pKey);
  if (((iVar1 != 0) && (zReplace = jx9_value_to_string(pData_local,(int *)&nOfft), 0 < (int)nOfft))
     && (iVar1 = (**(code **)(zTarget + 8))(_nLen->pBlob,_nLen->nByte,zReplace,nOfft,&local_54),
        iVar1 == 0)) {
    pWorker = (SyBlob *)jx9_value_to_string((jx9_value *)pUserData_local,&rc);
    StringReplace(_nLen,local_54,nOfft,(char *)pWorker,rc);
  }
  return 0;
}

Assistant:

static int StringReplaceWalker(jx9_value *pKey, jx9_value *pData, void *pUserData)
{
	str_replace_data *pRepData = (str_replace_data *)pUserData;
	const char *zTarget, *zReplace;
	SyBlob *pWorker;
	int tLen, nLen;
	sxu32 nOfft;
	sxi32 rc;
	/* Point to the working buffer */
	pWorker = pRepData->pWorker;
	if( !jx9_value_is_string(pKey) ){
		/* Target and replace must be a string */
		return JX9_OK;
	}
	/* Extract the target and the replace */
	zTarget = jx9_value_to_string(pKey, &tLen);
	if( tLen < 1 ){
		/* Empty target, return immediately */
		return JX9_OK;
	}
	/* Perform a pattern search */
	rc = pRepData->xMatch(SyBlobData(pWorker), SyBlobLength(pWorker), (const void *)zTarget, (sxu32)tLen, &nOfft);
	if( rc != SXRET_OK ){
		/* Pattern not found */
		return JX9_OK;
	}
	/* Extract the replace string */
	zReplace = jx9_value_to_string(pData, &nLen);
	/* Perform the replace process */
	StringReplace(pWorker, nOfft, tLen, zReplace, nLen);
	/* All done */
	return JX9_OK;
}